

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void GetHostName(string *hostname)

{
  char *pcVar1;
  int iVar2;
  utsname buf;
  utsname local_19e;
  
  iVar2 = uname(&local_19e);
  if (iVar2 < 0) {
    local_19e.nodename[0] = '\0';
  }
  pcVar1 = (char *)hostname->_M_string_length;
  strlen(local_19e.nodename);
  std::__cxx11::string::_M_replace((ulong)hostname,0,pcVar1,(ulong)local_19e.nodename);
  return;
}

Assistant:

static void GetHostName(string* hostname) {
#if defined(HAVE_SYS_UTSNAME_H)
  struct utsname buf;
  if (uname(&buf) < 0) {
    // ensure null termination on failure
    *buf.nodename = '\0';
  }
  *hostname = buf.nodename;
#elif defined(GLOG_OS_WINDOWS)
  char buf[MAX_COMPUTERNAME_LENGTH + 1];
  DWORD len = MAX_COMPUTERNAME_LENGTH + 1;
  if (GetComputerNameA(buf, &len)) {
    *hostname = buf;
  } else {
    hostname->clear();
  }
#else
#  warning There is no way to retrieve the host name.
  *hostname = "(unknown)";
#endif
}